

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_throttle_configure
               (ENetPeer *peer,uint32_t interval,uint32_t acceleration,uint32_t deceleration,
               uint32_t threshold)

{
  undefined1 local_50 [8];
  ENetProtocol command;
  uint32_t threshold_local;
  uint32_t deceleration_local;
  uint32_t acceleration_local;
  uint32_t interval_local;
  ENetPeer *peer_local;
  
  peer->packetThrottleThreshold = threshold;
  peer->packetThrottleInterval = interval;
  peer->packetThrottleAcceleration = acceleration;
  peer->packetThrottleDeceleration = deceleration;
  local_50[0] = 0x8b;
  local_50[1] = 0xff;
  command.connect.connectID = threshold;
  command.connect.data = deceleration;
  threshold_local = acceleration;
  deceleration_local = interval;
  _acceleration_local = peer;
  local_50._4_4_ = htonl(interval);
  command.header = (ENetProtocolCommandHeader)htonl(threshold_local);
  command.disconnect.data = htonl(command.connect.data);
  enet_peer_queue_outgoing_command
            (_acceleration_local,(ENetProtocol *)local_50,(ENetPacket *)0x0,0,0);
  return;
}

Assistant:

void enet_peer_throttle_configure(ENetPeer* peer, uint32_t interval, uint32_t acceleration, uint32_t deceleration, uint32_t threshold) {
	ENetProtocol command;
	peer->packetThrottleThreshold = threshold;
	peer->packetThrottleInterval = interval;
	peer->packetThrottleAcceleration = acceleration;
	peer->packetThrottleDeceleration = deceleration;
	command.header.command = ENET_PROTOCOL_COMMAND_THROTTLE_CONFIGURE | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.throttleConfigure.packetThrottleInterval = ENET_HOST_TO_NET_32(interval);
	command.throttleConfigure.packetThrottleAcceleration = ENET_HOST_TO_NET_32(acceleration);
	command.throttleConfigure.packetThrottleDeceleration = ENET_HOST_TO_NET_32(deceleration);

	enet_peer_queue_outgoing_command(peer, &command, NULL, 0, 0);
}